

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool str_is_printable(char *value)

{
  char cVar1;
  uchar *_value;
  
  do {
    cVar1 = *value;
    if ((cVar1 == '\0') || (cVar1 == '\x7f')) break;
    value = value + 1;
  } while ((byte)(cVar1 - 0x20U) < 0xdf);
  return cVar1 == '\0';
}

Assistant:

bool
str_is_printable(const char *value) {
  const unsigned char *_value;

  _value = (const unsigned char *)value;

  while (*_value) {
    if (!str_char_is_printable(*_value)) {
      return false;
    }
    _value++;
  }
  return true;
}